

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::XmlUnitTestResultPrinter::OutputXmlTestProperties
               (ostream *stream,TestResult *result,string *indent)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  char *pcVar4;
  allocator local_119;
  string local_118;
  string local_f8;
  allocator local_d1;
  string local_d0;
  string local_b0;
  TestProperty *local_90;
  TestProperty *property;
  undefined4 local_80;
  int i;
  string local_78 [8];
  string kProperty;
  allocator local_41;
  string local_40 [8];
  string kProperties;
  string *indent_local;
  TestResult *result_local;
  ostream *stream_local;
  
  kProperties.field_2._8_8_ = indent;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"properties",&local_41);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"property",(allocator *)((long)&i + 3));
  std::allocator<char>::~allocator((allocator<char> *)((long)&i + 3));
  iVar1 = TestResult::test_property_count(result);
  if (iVar1 < 1) {
    local_80 = 1;
  }
  else {
    poVar3 = std::operator<<(stream,(string *)kProperties.field_2._8_8_);
    poVar3 = std::operator<<(poVar3,"<");
    poVar3 = std::operator<<(poVar3,local_40);
    std::operator<<(poVar3,">\n");
    property._4_4_ = 0;
    while( true ) {
      iVar1 = property._4_4_;
      iVar2 = TestResult::test_property_count(result);
      if (iVar2 <= iVar1) break;
      local_90 = TestResult::GetTestProperty(result,property._4_4_);
      poVar3 = std::operator<<(stream,(string *)kProperties.field_2._8_8_);
      poVar3 = std::operator<<(poVar3,"  <");
      std::operator<<(poVar3,local_78);
      poVar3 = std::operator<<(stream," name=\"");
      pcVar4 = TestProperty::key(local_90);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_d0,pcVar4,&local_d1);
      EscapeXmlAttribute(&local_b0,&local_d0);
      poVar3 = std::operator<<(poVar3,(string *)&local_b0);
      std::operator<<(poVar3,"\"");
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_d1);
      poVar3 = std::operator<<(stream," value=\"");
      pcVar4 = TestProperty::value(local_90);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_118,pcVar4,&local_119);
      EscapeXmlAttribute(&local_f8,&local_118);
      poVar3 = std::operator<<(poVar3,(string *)&local_f8);
      std::operator<<(poVar3,"\"");
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_118);
      std::allocator<char>::~allocator((allocator<char> *)&local_119);
      std::operator<<(stream,"/>\n");
      property._4_4_ = property._4_4_ + 1;
    }
    poVar3 = std::operator<<(stream,(string *)kProperties.field_2._8_8_);
    poVar3 = std::operator<<(poVar3,"</");
    poVar3 = std::operator<<(poVar3,local_40);
    std::operator<<(poVar3,">\n");
    local_80 = 0;
  }
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void XmlUnitTestResultPrinter::OutputXmlTestProperties(
    std::ostream* stream, const TestResult& result, const std::string& indent) {
  const std::string kProperties = "properties";
  const std::string kProperty = "property";

  if (result.test_property_count() <= 0) {
    return;
  }

  *stream << indent << "<" << kProperties << ">\n";
  for (int i = 0; i < result.test_property_count(); ++i) {
    const TestProperty& property = result.GetTestProperty(i);
    *stream << indent << "  <" << kProperty;
    *stream << " name=\"" << EscapeXmlAttribute(property.key()) << "\"";
    *stream << " value=\"" << EscapeXmlAttribute(property.value()) << "\"";
    *stream << "/>\n";
  }
  *stream << indent << "</" << kProperties << ">\n";
}